

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O2

vector<serial::PortInfo,_std::allocator<serial::PortInfo>_> * serial::list_ports(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  vector<serial::PortInfo,_std::allocator<serial::PortInfo>_> *in_RDI;
  ulong uVar4;
  pointer pbVar5;
  string friendly_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_globs;
  glob_t glob_results;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sysfs_info;
  string sys_device_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  devices_found;
  string hardware_id;
  string sys_id_path;
  string device;
  string local_70;
  string local_50 [32];
  
  (in_RDI->super__Vector_base<serial::PortInfo,_std::allocator<serial::PortInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<serial::PortInfo,_std::allocator<serial::PortInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<serial::PortInfo,_std::allocator<serial::PortInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  search_globs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  search_globs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  search_globs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glob_results,"/dev/ttyACM*",(allocator<char> *)&friendly_name);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&search_globs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&glob_results);
  std::__cxx11::string::~string((string *)&glob_results);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glob_results,"/dev/ttyS*",(allocator<char> *)&friendly_name);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&search_globs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&glob_results);
  std::__cxx11::string::~string((string *)&glob_results);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glob_results,"/dev/ttyUSB*",(allocator<char> *)&friendly_name);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&search_globs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&glob_results);
  std::__cxx11::string::~string((string *)&glob_results);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glob_results,"/dev/tty.*",(allocator<char> *)&friendly_name);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&search_globs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&glob_results);
  std::__cxx11::string::~string((string *)&glob_results);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glob_results,"/dev/cu.*",(allocator<char> *)&friendly_name);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&search_globs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&glob_results);
  std::__cxx11::string::~string((string *)&glob_results);
  devices_found.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  devices_found.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  devices_found.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (search_globs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      search_globs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    glob(((search_globs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,0,(__errfunc *)0x0,
         (glob_t *)&glob_results);
    pbVar5 = search_globs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (pbVar5 = pbVar5 + 1,
          pbVar5 != search_globs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
      glob((pbVar5->_M_dataplus)._M_p,0x20,(__errfunc *)0x0,(glob_t *)&glob_results);
    }
    for (uVar4 = 0; uVar4 < glob_results.gl_pathc; uVar4 = uVar4 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&friendly_name,glob_results.gl_pathv[uVar4],
                 (allocator<char> *)&hardware_id);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&devices_found
                 ,&friendly_name);
      std::__cxx11::string::~string((string *)&friendly_name);
    }
    globfree((glob_t *)&glob_results);
  }
  pbVar5 = devices_found.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar5 == devices_found.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&devices_found);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&search_globs);
      return in_RDI;
    }
    std::__cxx11::string::string((string *)&device,(string *)pbVar5);
    lVar3 = std::__cxx11::string::rfind((char *)&device,0x10da09);
    if (lVar3 == -1) {
      std::__cxx11::string::string((string *)&glob_results,(string *)&device);
    }
    else {
      std::__cxx11::string::string
                ((string *)&glob_results,(string *)&device,lVar3 + 1,0xffffffffffffffff);
    }
    friendly_name._M_dataplus._M_p = (pointer)&friendly_name.field_2;
    friendly_name._M_string_length = 0;
    hardware_id._M_dataplus._M_p = (pointer)&hardware_id.field_2;
    hardware_id._M_string_length = 0;
    friendly_name.field_2._M_local_buf[0] = '\0';
    hardware_id.field_2._M_local_buf[0] = '\0';
    format_abi_cxx11_(&sys_device_path,"/sys/class/tty/%s/device",glob_results.gl_pathc);
    iVar2 = std::__cxx11::string::compare((ulong)&glob_results,0,(char *)0x6);
    if (iVar2 == 0) {
      realpath((char *)local_50,(char *)&sys_device_path);
      dirname((char *)&local_70);
      dirname((char *)&sys_id_path);
      std::__cxx11::string::operator=((string *)&sys_device_path,(string *)&sys_id_path);
      std::__cxx11::string::~string((string *)&sys_id_path);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string(local_50);
      bVar1 = path_exists(&sys_device_path);
      if (bVar1) {
        usb_sysfs_friendly_name(&sys_id_path,&sys_device_path);
        std::__cxx11::string::operator=((string *)&friendly_name,(string *)&sys_id_path);
        std::__cxx11::string::~string((string *)&sys_id_path);
        usb_sysfs_hw_string(&sys_id_path,&sys_device_path);
LAB_0010ba2e:
        std::__cxx11::string::operator=((string *)&hardware_id,(string *)&sys_id_path);
        goto LAB_0010ba3c;
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((ulong)&glob_results,0,(char *)0x6);
      if (iVar2 == 0) {
        realpath((char *)&local_70,(char *)&sys_device_path);
        dirname((char *)&sys_id_path);
        std::__cxx11::string::operator=((string *)&sys_device_path,(string *)&sys_id_path);
        std::__cxx11::string::~string((string *)&sys_id_path);
        std::__cxx11::string::~string((string *)&local_70);
        bVar1 = path_exists(&sys_device_path);
        if (bVar1) {
          usb_sysfs_friendly_name(&sys_id_path,&sys_device_path);
          std::__cxx11::string::operator=((string *)&friendly_name,(string *)&sys_id_path);
          std::__cxx11::string::~string((string *)&sys_id_path);
          usb_sysfs_hw_string(&sys_id_path,&sys_device_path);
          goto LAB_0010ba2e;
        }
      }
      else {
        std::operator+(&sys_id_path,&sys_device_path,"/id");
        bVar1 = path_exists(&sys_id_path);
        if (bVar1) {
          read_line(&local_70,&sys_id_path);
          std::__cxx11::string::operator=((string *)&hardware_id,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
LAB_0010ba3c:
        std::__cxx11::string::~string((string *)&sys_id_path);
      }
    }
    if (friendly_name._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&friendly_name);
    }
    if (hardware_id._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&hardware_id);
    }
    sysfs_info.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sysfs_info.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sysfs_info.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&sysfs_info,&friendly_name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&sysfs_info,&hardware_id);
    std::__cxx11::string::~string((string *)&sys_device_path);
    std::__cxx11::string::~string((string *)&hardware_id);
    std::__cxx11::string::~string((string *)&friendly_name);
    std::__cxx11::string::~string((string *)&glob_results);
    std::__cxx11::string::string
              ((string *)&friendly_name,
               (string *)
               sysfs_info.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::string
              ((string *)&hardware_id,
               (string *)
               (sysfs_info.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1));
    glob_results.gl_pathc = (__size_t)&glob_results.gl_offs;
    glob_results.gl_pathv = (char **)0x0;
    glob_results.gl_offs._0_1_ = 0;
    glob_results.gl_closedir = (_func_void_void_ptr *)&glob_results.gl_opendir;
    glob_results.gl_readdir = (_func_dirent_ptr_void_ptr *)0x0;
    glob_results.gl_opendir._0_1_ = 0;
    glob_results.gl_stat = (_func_int_char_ptr_stat_ptr *)&local_138;
    local_138._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&glob_results);
    std::__cxx11::string::_M_assign((string *)&glob_results.gl_closedir);
    std::__cxx11::string::_M_assign((string *)&glob_results.gl_stat);
    std::vector<serial::PortInfo,_std::allocator<serial::PortInfo>_>::push_back
              (in_RDI,(PortInfo *)&glob_results);
    pbVar5 = pbVar5 + 1;
    PortInfo::~PortInfo((PortInfo *)&glob_results);
    std::__cxx11::string::~string((string *)&hardware_id);
    std::__cxx11::string::~string((string *)&friendly_name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sysfs_info);
    std::__cxx11::string::~string((string *)&device);
  } while( true );
}

Assistant:

bool
path_exists(const string& path)
{
    struct stat sb;

    if( stat(path.c_str(), &sb ) == 0 )
        return true;

    return false;
}